

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void __thiscall
yactfr::internal::JsonFlFloatTypeValReq::_validate(JsonFlFloatTypeValReq *this,JsonVal *jsonVal)

{
  unsigned_long_long uVar1;
  string msg;
  JsonObjVal *pJVar2;
  JsonVal *this_00;
  JsonUIntVal *pJVar3;
  ostream *poVar4;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe20;
  TextLocation in_stack_fffffffffffffe28;
  string local_190 [11];
  
  JsonObjValReq::_validate((JsonObjValReq *)this,jsonVal);
  pJVar2 = JsonVal::asObj(jsonVal);
  std::__cxx11::string::string((string *)local_190,"length",(allocator *)&stack0xfffffffffffffe2f);
  this_00 = MapItemMixin<yactfr::internal::JsonVal>::_tryAt
                      (&pJVar2->super_MapItemMixin<yactfr::internal::JsonVal>,local_190);
  std::__cxx11::string::~string((string *)local_190);
  pJVar3 = JsonVal::asUInt(this_00);
  uVar1 = (pJVar3->super_ScalarValItemMixin<unsigned_long_long>)._theVal;
  if ((uVar1 != 0x20) && (uVar1 != 0x40)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    poVar4 = std::operator<<((ostream *)local_190,"Unexpected length ");
    poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
    std::operator<<(poVar4,": yactfr only supports 32 and 64.");
    std::__cxx11::stringbuf::str();
    msg.field_2._8_8_ = in_stack_fffffffffffffe20;
    msg._0_24_ = this_00->_loc;
    throwTextParseError(msg,in_stack_fffffffffffffe28);
  }
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonDtValReq::_validate(jsonVal);

            auto& jsonLenVal = *jsonVal.asObj()[strs::len];
            const auto len = *jsonLenVal.asUInt();

            if (len != 32 && len != 64) {
                std::ostringstream ss;

                ss << "Unexpected length " << len << ": yactfr only supports 32 and 64.";
                throwTextParseError(ss.str(), jsonLenVal.loc());
            }
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc,
                                      "Invalid fixed-length floating-point number type:",
                                      jsonVal.loc());
            throw;
        }
    }